

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSamplerYcbcrConversionCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSamplerYcbcrConversionCreateInfo>
          (Impl *this,VkSamplerYcbcrConversionCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkSamplerYcbcrConversionCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSamplerYcbcrConversionCreateInfo>(alloc,count);
    if (pVVar1 != (VkSamplerYcbcrConversionCreateInfo *)0x0) {
      pVVar1 = (VkSamplerYcbcrConversionCreateInfo *)memmove(pVVar1,src,count << 6);
      return pVVar1;
    }
  }
  return (VkSamplerYcbcrConversionCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}